

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_timestamp.cpp
# Opt level: O2

dtime_tz_t duckdb::ParquetIntToTimeNsTZ(int64_t *raw_nanos)

{
  dtime_t dVar1;
  long lVar2;
  
  lVar2 = 86400000000000;
  if (*raw_nanos != 86400000000000) {
    lVar2 = *raw_nanos % 86400000000000;
    lVar2 = (lVar2 >> 0x3f & 86400000000000U) + lVar2;
  }
  dVar1 = Time::FromTimeNs(lVar2);
  return (dtime_tz_t)(dVar1.micros << 0x18 | 0xe0ff);
}

Assistant:

dtime_tz_t ParquetIntToTimeNsTZ(const int64_t &raw_nanos) {
	const auto nanos = ParquetWrapTime(raw_nanos, Interval::NANOS_PER_DAY);
	return dtime_tz_t(Time::FromTimeNs(nanos), 0);
}